

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  TypedID<(spirv_cross::Types)1> id;
  uint32_t uVar5;
  SPIRType *type_00;
  size_type sVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  mapped_type *this_00;
  TypedID<(spirv_cross::Types)1> *pTVar9;
  string *psVar10;
  CompilerError *pCVar11;
  SPIRType *pSVar12;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar13;
  bool local_4d1;
  char *local_4a8;
  char *local_4a0;
  byte local_47c;
  byte local_479;
  bool local_451;
  undefined1 local_450 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0 [39];
  char local_3c9;
  undefined1 local_3c8 [64];
  spirv_cross local_388 [36];
  uint32_t local_364;
  uint32_t local_360;
  uint32_t failed_index_1;
  string local_358 [36];
  uint32_t local_334;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  spirv_cross local_310 [32];
  undefined1 local_2f0 [8];
  string member_name;
  string local_2c8 [8];
  string backup_name;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end4;
  TypedID<(spirv_cross::Types)1> *__begin4;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range4;
  undefined1 local_280 [4];
  uint32_t i;
  uint32_t local_25c;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_258;
  char local_250;
  char local_241;
  undefined1 local_240 [68];
  uint32_t local_1fc;
  spirv_cross local_1f8 [4];
  uint32_t failed_index;
  uint32_t local_1d4;
  string local_1d0 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_198;
  key_type local_190 [8];
  string buffer_name;
  uint32_t local_16c;
  undefined1 local_168 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  TypedID<(spirv_cross::Types)0> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  char *local_e0;
  spirv_cross local_d8 [32];
  string local_b8 [8];
  string type_name;
  undefined1 local_98 [8];
  anon_class_8_1_8991fb9c to_structuredbuffer_subtype_name;
  bool is_interlocked;
  bool is_coherent;
  undefined1 local_70 [7];
  bool is_readonly;
  Bitset flags;
  bool is_uav;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  local_451 = true;
  if (var->storage != StorageClassStorageBuffer) {
    local_451 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type_00->super_IVariant).self.id,
                           DecorationBufferBlock);
  }
  flags.higher._M_h._M_single_bucket._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  sVar6 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->super_CompilerGLSL).flattened_buffer_blocks,
                  (key_type *)((long)&flags.higher._M_h._M_single_bucket + 4));
  if (sVar6 == 0) {
    if (local_451 == false) {
      bVar1 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
      uVar3 = (uint32_t)type_00;
      if (bVar1) {
        local_16c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        pmVar7 = ::std::
                 unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                 ::operator[](&(this->super_CompilerGLSL).flattened_structs,&local_16c);
        *pmVar7 = false;
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_190,this,(ulong)uVar5,0);
        ::std::
        unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
        ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                     &(type_00->super_IVariant).self);
        bVar2 = ::std::__cxx11::string::empty();
        local_4d1 = true;
        if ((bVar2 & 1) == 0) {
          local_198._M_cur =
               (__node_type *)
               ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->super_CompilerGLSL).resource_names,local_190);
          local_1a0._M_cur =
               (__node_type *)
               ::std::
               end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                         (&(this->super_CompilerGLSL).resource_names);
          bVar1 = ::std::__detail::operator!=(&local_198,&local_1a0);
          local_4d1 = true;
          if (!bVar1) {
            local_1a8._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&(this->super_CompilerGLSL).block_names,local_190);
            local_1b0._M_cur =
                 (__node_type *)
                 ::std::
                 end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                           (&(this->super_CompilerGLSL).block_names);
            local_4d1 = ::std::__detail::operator!=(&local_1a8,&local_1b0);
          }
        }
        if (local_4d1 != false) {
          local_1d4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(var->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                    (local_1d0,this,(ulong)local_1d4);
          ::std::__cxx11::string::operator=((string *)local_190,local_1d0);
          ::std::__cxx11::string::~string(local_1d0);
        }
        CompilerGLSL::add_variable
                  (&this->super_CompilerGLSL,&(this->super_CompilerGLSL).block_names,
                   &(this->super_CompilerGLSL).resource_names,local_190);
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(var->super_IVariant).field_0xc);
          pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                    (local_1f8,(char (*) [2])0x40fecd,&(pSVar12->super_IVariant).self,
                     (char (*) [2])0x40fecd,&(var->super_IVariant).self);
          ::std::__cxx11::string::operator=((string *)local_190,(string *)local_1f8);
          ::std::__cxx11::string::~string((string *)local_1f8);
        }
        local_1fc = 0;
        bVar1 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbufferPackOffset,
                           &local_1fc,0,0xffffffff);
        if (!bVar1) {
          local_241 = '\x01';
          pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_240,(SPIRType *)this,uVar3);
          join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    ((spirv_cross *)(local_240 + 0x20),(char (*) [12])0x40f7a5,
                     &(var->super_IVariant).self,(char (*) [9])" (name: ",local_190,
                     (char (*) [17])"), member index ",&local_1fc,(char (*) [9])" (name: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     (char (*) [69])
                     ") cannot be expressed with either HLSL packing layout or packoffset.");
          CompilerError::CompilerError(pCVar11,(string *)(local_240 + 0x20));
          local_241 = '\0';
          __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        Compiler::set_extended_decoration
                  ((Compiler *)this,uVar5,SPIRVCrossDecorationExplicitOffset,0);
        pVar13 = ::std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&(this->super_CompilerGLSL).block_names,local_190);
        local_258._M_cur =
             (__node_type *)
             pVar13.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        local_250 = pVar13.second;
        local_25c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        this_00 = ::std::
                  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                               &local_25c);
        ::std::__cxx11::string::operator=((string *)this_00,(string *)local_190);
        ::std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&type_00->member_name_cache);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,uVar5);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
        to_resource_binding_abi_cxx11_((CompilerHLSL *)local_280,(SPIRVariable *)this);
        CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
        ::std::__cxx11::string::~string((string *)local_280);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        __range4._4_4_ = 0;
        __end4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                           (&(type_00->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        pTVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                           (&(type_00->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        for (; __end4 != pTVar9; __end4 = __end4 + 1) {
          CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type_00,__range4._4_4_);
          id = TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          psVar10 = Compiler::get_member_name_abi_cxx11_
                              ((Compiler *)this,(TypeID)id.id,__range4._4_4_);
          ::std::__cxx11::string::string(local_2c8,(string *)psVar10);
          CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_2f0,(SPIRType *)this,uVar3);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_330,this,(ulong)uVar5,1);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (local_310,local_330,(char (*) [2])0x40fecd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0)
          ;
          ::std::__cxx11::string::operator=((string *)local_2f0,(string *)local_310);
          ::std::__cxx11::string::~string((string *)local_310);
          ::std::__cxx11::string::~string((string *)local_330);
          ParsedIR::sanitize_underscores((string *)local_2f0);
          local_334 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          Compiler::set_member_name
                    ((Compiler *)this,(TypeID)local_334,__range4._4_4_,(string *)local_2f0);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end4);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_358,"",(allocator *)((long)&failed_index_1 + 3));
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                    (this,type_00,(ulong)uVar5,(ulong)__range4._4_4_,local_358,0);
          ::std::__cxx11::string::~string(local_358);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&failed_index_1 + 3));
          local_360 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          Compiler::set_member_name
                    ((Compiler *)this,(TypeID)local_360,__range4._4_4_,(string *)local_2c8);
          __range4._4_4_ = __range4._4_4_ + 1;
          ::std::__cxx11::string::~string((string *)local_2f0);
          ::std::__cxx11::string::~string(local_2c8);
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x400321);
        ::std::__cxx11::string::~string((string *)local_190);
      }
      else {
        if ((this->hlsl_options).shader_model < 0x33) {
          pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar11,
                     "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                    );
          __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
        local_364 = 0;
        bVar1 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbuffer,&local_364,0,
                           0xffffffff);
        if (!bVar1) {
          local_3c9 = '\x01';
          pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_3c8 + 0x20,this,(ulong)uVar5,1);
          CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_3c8,(SPIRType *)this,uVar3);
          join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                    (local_388,(char (*) [27])"HLSL ConstantBuffer<T> ID ",
                     &(var->super_IVariant).self,(char (*) [9])" (name: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3c8 + 0x20),(char (*) [17])"), member index ",&local_364,
                     (char (*) [9])" (name: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                     (char (*) [54])") cannot be expressed with normal HLSL packing rules.");
          CompilerError::CompilerError(pCVar11,(string *)local_388);
          local_3c9 = '\0';
          __cxa_throw(pCVar11,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        pSVar12 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar12);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_3f0,this,(ulong)uVar3,1);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_410,this,(ulong)uVar3,1);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (local_450 + 0x20,this,type_00,(ulong)uVar3);
        to_resource_binding_abi_cxx11_((CompilerHLSL *)local_450,(SPIRVariable *)this);
        CompilerGLSL::
        statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",local_3f0,
                   (char (*) [3])0x40ac61,local_410,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_450 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)local_450);
        ::std::__cxx11::string::~string((string *)(local_450 + 0x20));
        ::std::__cxx11::string::~string((string *)local_410);
        ::std::__cxx11::string::~string((string *)local_3f0);
      }
    }
    else {
      ParsedIR::get_buffer_block_flags
                ((Bitset *)local_70,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      bVar1 = Bitset::get((Bitset *)local_70,0x18);
      local_479 = 0;
      if (bVar1) {
        bVar1 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
        local_479 = bVar1 ^ 0xff;
      }
      local_479 = local_479 & 1;
      bVar1 = Bitset::get((Bitset *)local_70,0x17);
      local_47c = 0;
      if (bVar1) {
        local_47c = local_479 ^ 0xff;
      }
      to_structuredbuffer_subtype_name.this._7_1_ = local_47c & 1;
      to_structuredbuffer_subtype_name.this._0_4_ =
           TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      sVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                      (key_type *)&to_structuredbuffer_subtype_name);
      to_structuredbuffer_subtype_name.this._6_1_ = sVar6 != 0;
      local_98 = (undefined1  [8])this;
      ::std::__cxx11::string::string(local_b8);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      uVar4 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(this,(ulong)uVar3);
      if ((uVar4 & 1) == 0) {
        if (local_479 == 0) {
          local_4a8 = "RWByteAddressBuffer";
          if ((to_structuredbuffer_subtype_name.this._6_1_ & 1) != 0) {
            local_4a8 = "RasterizerOrderedByteAddressBuffer";
          }
        }
        else {
          local_4a8 = "ByteAddressBuffer";
        }
        ::std::__cxx11::string::operator=(local_b8,local_4a8);
      }
      else {
        if (local_479 == 0) {
          local_4a0 = "RW";
          if ((to_structuredbuffer_subtype_name.this._6_1_ & 1) != 0) {
            local_4a0 = "RasterizerOrdered";
          }
        }
        else {
          local_4a0 = "";
        }
        local_e0 = local_4a0;
        emit_buffer_block(spirv_cross::SPIRVariable_const&)::$_0::operator()::SPIRType_const___const
                  (local_100,(SPIRType *)local_98);
        join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
                  (local_d8,&local_e0,(char (*) [18])"StructuredBuffer<",local_100,
                   (char (*) [2])0x4222ea);
        ::std::__cxx11::string::operator=(local_b8,(string *)local_d8);
        ::std::__cxx11::string::~string((string *)local_d8);
        ::std::__cxx11::string::~string((string *)local_100);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
      local_108 = (TypedID<(spirv_cross::Types)0> *)0x400321;
      if ((to_structuredbuffer_subtype_name.this._7_1_ & 1) != 0) {
        local_108 = (TypedID<(spirv_cross::Types)0> *)0x40f668;
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_128,this,(ulong)uVar3,1);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (local_168 + 0x20,this,type_00,(ulong)uVar3);
      to_resource_binding_abi_cxx11_((CompilerHLSL *)local_168,(SPIRVariable *)this);
      CompilerGLSL::
      statement<char_const*,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char **)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char (*) [2])0x40c6cb,local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_168);
      ::std::__cxx11::string::~string((string *)(local_168 + 0x20));
      ::std::__cxx11::string::~string((string *)local_128);
      ::std::__cxx11::string::~string(local_b8);
      Bitset::~Bitset((Bitset *)local_70);
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,var);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;

		auto to_structuredbuffer_subtype_name = [this](const SPIRType &parent_type) -> std::string
		{
			if (parent_type.basetype == SPIRType::Struct && parent_type.member_types.size() == 1)
			{
				// Use type of first struct member as a StructuredBuffer will have only one '._m0' field in SPIR-V
				const auto &member0_type = this->get<SPIRType>(parent_type.member_types.front());
				return this->type_to_glsl(member0_type);
			}
			else
			{
				// Otherwise, this StructuredBuffer only has a basic subtype, e.g. StructuredBuffer<int>
				return this->type_to_glsl(parent_type);
			}
		};

		std::string type_name;
		if (is_user_type_structured(var.self))
			type_name = join(is_readonly ? "" : is_interlocked ? "RasterizerOrdered" : "RW", "StructuredBuffer<", to_structuredbuffer_subtype_name(type), ">");
		else
			type_name = is_readonly ? "ByteAddressBuffer" : is_interlocked ? "RasterizerOrderedByteAddressBuffer" : "RWByteAddressBuffer";

		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, " ", to_name(var.self), type_to_array_glsl(type, var.self),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type, var.self),
			          to_resource_binding(var), ";");
		}
	}
}